

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall
BackwardPass::ProcessArrayRegOpndUse(BackwardPass *this,Instr *instr,ArrayRegOpnd *arrayRegOpnd)

{
  ushort uVar1;
  code *pcVar2;
  BasicBlock *pBVar3;
  BackwardPass *pBVar4;
  bool bVar5;
  bool bVar6;
  BOOLEAN BVar7;
  ObjectType OVar8;
  ObjectType OVar9;
  undefined4 *puVar10;
  StackSym *pSVar11;
  RegOpnd *pRVar12;
  RegOpnd *pRVar13;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  Opnd *pOVar14;
  Instr *pIVar15;
  Instr *this_00;
  IndirOpnd *pIVar16;
  ArrayRegOpnd *pAVar17;
  Opnd *pOVar18;
  Opnd *checkedSrc_1;
  int i;
  long lVar19;
  Opnd *checkedSrc;
  Opnd *local_78 [2];
  BasicBlock *local_68;
  BackwardPass *local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  ArrayRegOpnd *local_50;
  Instr *local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  undefined4 local_3c;
  char cStack_38;
  ValueType arrayValueType;
  
  if (this->tag != DeadStorePhase) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1230,"(tag == Js::DeadStorePhase)","tag == Js::DeadStorePhase");
    if (!bVar5) goto LAB_003cfce5;
    *puVar10 = 0;
  }
  if (this->isCollectionPass == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1231,"(!IsCollectionPass())","!IsCollectionPass()");
    if (!bVar5) goto LAB_003cfce5;
    *puVar10 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1232,"(instr)","instr");
    if (!bVar5) goto LAB_003cfce5;
    *puVar10 = 0;
  }
  if (arrayRegOpnd == (ArrayRegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x1233,"(arrayRegOpnd)","arrayRegOpnd");
    if (!bVar5) goto LAB_003cfce5;
    *puVar10 = 0;
  }
  if (((arrayRegOpnd->headSegmentSym == (StackSym *)0x0) &&
      (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)) &&
     (pSVar11 = IR::ArrayRegOpnd::LengthSym(arrayRegOpnd), pSVar11 == (StackSym *)0x0)) {
    return;
  }
  local_3e = (arrayRegOpnd->super_RegOpnd).super_Opnd.m_valueType.field_0;
  bVar5 = ValueType::IsLikelyTypedArray((ValueType *)&local_3e.field_0);
  bVar6 = ValueType::IsArrayOrObjectWithArray((ValueType *)&local_3e.field_0);
  if (bVar5 == bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x123c,"(isJsArray == arrayValueType.IsArrayOrObjectWithArray())",
                       "isJsArray == arrayValueType.IsArrayOrObjectWithArray()");
    if (!bVar6) goto LAB_003cfce5;
    *puVar10 = 0;
  }
  bVar6 = ValueType::IsOptimizedTypedArray((ValueType *)&local_3e.field_0);
  if (bVar5 != bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x123d,"(!isJsArray == arrayValueType.IsOptimizedTypedArray())",
                       "!isJsArray == arrayValueType.IsOptimizedTypedArray()");
    if (!bVar6) goto LAB_003cfce5;
    *puVar10 = 0;
  }
  local_68 = this->currentBlock;
  local_50 = arrayRegOpnd;
  if ((this->currentPrePassLoop == (Loop *)0x0) &&
     ((pSVar11 = arrayRegOpnd->headSegmentSym, pSVar11 != (StackSym *)0x0 ||
      (arrayRegOpnd->headSegmentLengthSym != (StackSym *)0x0)))) {
    if ((bVar5) || (instr->m_opcode != NoImplicitCallUses)) {
      uVar1 = *(ushort *)&instr->field_0x36;
      if ((uVar1 >> 10 & 1) == 0 || pSVar11 == (StackSym *)0x0) {
        _cStack_38 = 0;
      }
      else {
        BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                          (local_68->upwardExposedUses,(pSVar11->super_Sym).m_id);
        _cStack_38 = (undefined4)CONCAT71(extraout_var,BVar7 == '\0');
        uVar1 = *(ushort *)&instr->field_0x36;
      }
      if ((((uVar1 >> 0xb & 1) == 0) || (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)) ||
         (BVar7 = BVSparse<Memory::JitArenaAllocator>::Test
                            (local_68->upwardExposedUses,
                             (arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id), BVar7 != '\0'))
      {
        local_3c = 0;
LAB_003cf4c8:
        if ((cStack_38 == '\0') && ((char)local_3c == '\0')) goto LAB_003cf20c;
        if (!bVar5) goto LAB_003cfaac;
        local_48 = instr;
        if ((char)local_3c != '\0') {
          pRVar12 = IR::RegOpnd::New(local_50->headSegmentLengthSym,
                                     local_50->headSegmentLengthSym->m_type,instr->m_func);
          if (instr->m_opcode == NoImplicitCallUses) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                               ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                               "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
            if (!bVar6) goto LAB_003cfce5;
            *puVar10 = 0;
          }
          do {
            while( true ) {
              instr = instr->m_prev;
              if (((instr == (Instr *)0x0) || (instr->m_kind == InstrKindLabel)) ||
                 (instr->m_kind == InstrKindProfiledLabel)) goto LAB_003cf614;
              bVar6 = IR::Instr::IsRealInstr(instr);
              if (!bVar6) break;
              if ((instr->m_kind != InstrKindByteCodeUses) || (instr->m_opcode != ByteCodeUses))
              goto LAB_003cf614;
            }
          } while (instr->m_opcode != NoImplicitCallUses);
LAB_003cf614:
          for (; (instr != (Instr *)0x0 && (instr->m_opcode == NoImplicitCallUses));
              instr = instr->m_prev) {
            local_78[0] = instr->m_src1;
            local_78[1] = instr->m_src2;
            for (lVar19 = 0; (lVar19 != 2 && (pOVar18 = local_78[lVar19], pOVar18 != (Opnd *)0x0));
                lVar19 = lVar19 + 1) {
              bVar6 = IR::Opnd::IsEqual(pOVar18,&pRVar12->super_Opnd);
              if ((bVar6) &&
                 (pRVar13 = IR::Opnd::AsRegOpnd(pOVar18),
                 pRVar13->m_sym == local_50->headSegmentLengthSym)) goto LAB_003cf6fb;
            }
          }
          instr = (Instr *)0x0;
          pOVar18 = (Opnd *)0x0;
LAB_003cf6fb:
          IR::RegOpnd::FreeInternal(pRVar12,local_48->m_func);
          if (pOVar18 != (Opnd *)0x0) {
            if (instr == (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x12a6,"(noImplicitCallUsesInstr)","noImplicitCallUsesInstr");
              if (!bVar6) goto LAB_003cfce5;
              *puVar10 = 0;
            }
            if (instr->m_dst != (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x12a7,"(!noImplicitCallUsesInstr->GetDst())",
                                 "!noImplicitCallUsesInstr->GetDst()");
              if (!bVar6) goto LAB_003cfce5;
              *puVar10 = 0;
            }
            pOVar14 = instr->m_src1;
            if (pOVar14 == (Opnd *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                 ,0x12a8,"(noImplicitCallUsesInstr->GetSrc1())",
                                 "noImplicitCallUsesInstr->GetSrc1()");
              if (!bVar6) goto LAB_003cfce5;
              *puVar10 = 0;
              pOVar14 = instr->m_src1;
            }
            arrayRegOpnd = local_50;
            if (pOVar18 == pOVar14) {
              if (instr->m_src2 == (Opnd *)0x0) {
                IR::Instr::FreeSrc1(instr);
                instr->m_opcode = Nop;
              }
              else {
                pOVar18 = IR::Instr::UnlinkSrc2(instr);
                IR::Instr::ReplaceSrc1(instr,pOVar18);
              }
            }
            else {
              if (pOVar18 != instr->m_src2) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar10 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                   ,0x12b7,"(use == noImplicitCallUsesInstr->GetSrc2())",
                                   "use == noImplicitCallUsesInstr->GetSrc2()");
                if (!bVar6) goto LAB_003cfce5;
                *puVar10 = 0;
              }
              IR::Instr::FreeSrc2(instr);
            }
            pAVar17 = (ArrayRegOpnd *)0x0;
            bVar6 = cStack_38 == '\0';
            goto LAB_003cfc88;
          }
        }
        pAVar17 = (ArrayRegOpnd *)0x0;
LAB_003cfc52:
        bVar6 = cStack_38 == '\0';
        arrayRegOpnd = local_50;
      }
      else {
        local_3c = (undefined4)CONCAT71(extraout_var_00,1);
        if ((instr->field_0x37 & 0x10) == 0) goto LAB_003cf4c8;
        pIVar15 = GlobOpt::FindUpperBoundsCheckInstr(this->globOpt,instr);
        if (pIVar15 == (Instr *)0x0 || pIVar15 == instr) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1250,"(upperBoundCheck && upperBoundCheck != instr)",
                             "upperBoundCheck && upperBoundCheck != instr");
          if (!bVar6) goto LAB_003cfce5;
          *puVar10 = 0;
        }
        pRVar12 = IR::Opnd::AsRegOpnd(pIVar15->m_src2);
        if (pRVar12->m_sym != arrayRegOpnd->headSegmentLengthSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1251,
                             "(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                             ,
                             "upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                            );
          if (!bVar6) goto LAB_003cfce5;
          *puVar10 = 0;
        }
        this_00 = GlobOpt::FindArraySegmentLoadInstr(this->globOpt,pIVar15);
        pRVar12 = IR::Opnd::AsRegOpnd(this_00->m_dst);
        if (pRVar12->m_sym != arrayRegOpnd->headSegmentLengthSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1256,
                             "(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym())"
                             ,
                             "headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym()"
                            );
          if (!bVar6) goto LAB_003cfce5;
          *puVar10 = 0;
          arrayRegOpnd = local_50;
        }
        pIVar16 = IR::Opnd::AsIndirOpnd(this_00->m_src1);
        if (pIVar16->m_baseOpnd->m_sym != (&(arrayRegOpnd->super_RegOpnd).m_sym)[(ulong)!bVar5 * 2])
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1259,
                             "(headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym))"
                             ,
                             "headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym == (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym)"
                            );
          if (!bVar6) goto LAB_003cfce5;
          *puVar10 = 0;
          arrayRegOpnd = local_50;
        }
        pOVar18 = IR::Instr::UnlinkSrc1(this_00);
        pOVar18 = IR::Instr::ReplaceSrc2(pIVar15,pOVar18);
        this_00->m_opcode = Nop;
        local_3c = (undefined4)CONCAT71((int7)((ulong)pOVar18 >> 8),1);
        if (bVar5) goto LAB_003cf4c8;
        _cStack_38 = 0;
LAB_003cfaac:
        pIVar15 = instr;
        if (instr->m_opcode == NoImplicitCallUses) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                             "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
          if (!bVar6) goto LAB_003cfce5;
          *puVar10 = 0;
          pIVar15 = instr;
        }
        do {
          while( true ) {
            local_48 = pIVar15;
            instr = instr->m_prev;
            if (((instr == (Instr *)0x0) || (instr->m_kind == InstrKindLabel)) ||
               (instr->m_kind == InstrKindProfiledLabel)) goto LAB_003cfb51;
            bVar6 = IR::Instr::IsRealInstr(instr);
            pIVar15 = local_48;
            if (!bVar6) break;
            if ((instr->m_kind != InstrKindByteCodeUses) || (instr->m_opcode != ByteCodeUses))
            goto LAB_003cfb51;
          }
        } while (instr->m_opcode != NoImplicitCallUses);
LAB_003cfb51:
        local_60 = this;
        for (; (instr != (Instr *)0x0 && (instr->m_opcode == NoImplicitCallUses));
            instr = instr->m_prev) {
          local_78[0] = instr->m_src1;
          local_78[1] = instr->m_src2;
          for (lVar19 = 0; (lVar19 != 2 && (pOVar18 = local_78[lVar19], pOVar18 != (Opnd *)0x0));
              lVar19 = lVar19 + 1) {
            bVar6 = IR::Opnd::IsEqual(pOVar18,(Opnd *)arrayRegOpnd);
            if (bVar6) {
              local_52 = (pOVar18->m_valueType).field_0;
              bVar6 = ValueType::IsLikelyObject((ValueType *)&local_52.field_0);
              arrayRegOpnd = local_50;
              if (bVar6) {
                OVar8 = ValueType::GetObjectType((ValueType *)&local_52.field_0);
                OVar9 = ValueType::GetObjectType((ValueType *)&local_3e.field_0);
                arrayRegOpnd = local_50;
                if (OVar8 == OVar9) {
                  pRVar12 = IR::Opnd::AsRegOpnd(pOVar18);
                  bVar6 = IR::RegOpnd::IsArrayRegOpnd(pRVar12);
                  arrayRegOpnd = local_50;
                  if (bVar6) {
                    pAVar17 = IR::RegOpnd::AsArrayRegOpnd(pRVar12);
                    arrayRegOpnd = local_50;
                    if (((cStack_38 == '\0') ||
                        (pAVar17->headSegmentSym == local_50->headSegmentSym)) &&
                       (((char)local_3c == '\0' ||
                        (pAVar17->headSegmentLengthSym == local_50->headSegmentLengthSym)))) {
                      pRVar12 = IR::Opnd::AsRegOpnd(pOVar18);
                      pAVar17 = IR::RegOpnd::AsArrayRegOpnd(pRVar12);
                      this = local_60;
                      goto LAB_003cfc52;
                    }
                  }
                }
              }
            }
          }
        }
        pAVar17 = (ArrayRegOpnd *)0x0;
        bVar6 = cStack_38 == '\0';
        this = local_60;
      }
LAB_003cfc88:
      if ((!bVar6) &&
         (((bVar5 || (arrayRegOpnd->headSegmentLengthSym == (StackSym *)0x0)) ||
          ((char)local_3c != '\0')))) {
        arrayRegOpnd->headSegmentSym = (StackSym *)0x0;
        local_48->field_0x37 = local_48->field_0x37 & 0xfb;
        if (pAVar17 == (ArrayRegOpnd *)0x0) {
          pAVar17 = (ArrayRegOpnd *)0x0;
        }
        else {
          pAVar17->headSegmentSym = (StackSym *)0x0;
        }
      }
      instr = local_48;
      if ((char)local_3c != '\0') {
        arrayRegOpnd->headSegmentLengthSym = (StackSym *)0x0;
        local_48->field_0x37 = local_48->field_0x37 & 0xf7;
        if (pAVar17 != (ArrayRegOpnd *)0x0) {
          pAVar17->headSegmentLengthSym = (StackSym *)0x0;
        }
      }
      goto LAB_003cf20c;
    }
  }
  else {
LAB_003cf20c:
    if ((!bVar5) && (instr->m_opcode != NoImplicitCallUses)) {
      return;
    }
  }
  pAVar17 = arrayRegOpnd;
  if (arrayRegOpnd->headSegmentSym == (StackSym *)0x0) {
    pSVar11 = arrayRegOpnd->headSegmentLengthSym;
    if (pSVar11 != (StackSym *)0x0) {
      if (!bVar5) goto LAB_003cf413;
LAB_003cf292:
      pRVar12 = IR::RegOpnd::New(pSVar11,pSVar11->m_type,instr->m_func);
      local_48 = instr;
      if (instr->m_opcode == NoImplicitCallUses) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1207,"(instr->m_opcode != Js::OpCode::NoImplicitCallUses)",
                           "instr->m_opcode != Js::OpCode::NoImplicitCallUses");
        if (!bVar5) goto LAB_003cfce5;
        *puVar10 = 0;
        instr = local_48;
      }
      do {
        while( true ) {
          instr = instr->m_prev;
          pBVar4 = this;
          if (((instr == (Instr *)0x0) || (pBVar4 = this, instr->m_kind == InstrKindLabel)) ||
             (pBVar4 = this, instr->m_kind == InstrKindProfiledLabel)) goto LAB_003cf34d;
          bVar5 = IR::Instr::IsRealInstr(instr);
          if (!bVar5) break;
          pBVar4 = this;
          if ((instr->m_kind != InstrKindByteCodeUses) ||
             (pBVar4 = this, instr->m_opcode != ByteCodeUses)) goto LAB_003cf34d;
        }
        pBVar4 = this;
      } while (instr->m_opcode != NoImplicitCallUses);
LAB_003cf34d:
      for (; (local_60 = pBVar4, instr != (Instr *)0x0 && (instr->m_opcode == NoImplicitCallUses));
          instr = instr->m_prev) {
        local_78[0] = instr->m_src1;
        local_78[1] = instr->m_src2;
        for (lVar19 = 0; (lVar19 != 2 && (pOVar18 = local_78[lVar19], pOVar18 != (Opnd *)0x0));
            lVar19 = lVar19 + 1) {
          bVar5 = IR::Opnd::IsEqual(pOVar18,&pRVar12->super_Opnd);
          if ((bVar5) &&
             (pRVar13 = IR::Opnd::AsRegOpnd(pOVar18),
             pRVar13->m_sym == arrayRegOpnd->headSegmentLengthSym)) {
            IR::RegOpnd::FreeInternal(pRVar12,local_48->m_func);
            this = local_60;
            BVSparse<Memory::JitArenaAllocator>::Set
                      (local_60->considerSymsAsRealUsesInNoImplicitCallUses,
                       (arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id);
            pAVar17 = local_50;
            goto LAB_003cf63c;
          }
        }
        pBVar4 = local_60;
      }
      IR::RegOpnd::FreeInternal(pRVar12,local_48->m_func);
      this = local_60;
      pAVar17 = local_50;
    }
  }
  else {
    ProcessStackSymUse(this,arrayRegOpnd->headSegmentSym,'\x01');
    pBVar3 = local_68;
    if (bVar5) {
      pSVar11 = arrayRegOpnd->headSegmentLengthSym;
      if (pSVar11 != (StackSym *)0x0) goto LAB_003cf292;
    }
    else {
      BVSparse<Memory::JitArenaAllocator>::Set
                (local_68->noImplicitCallUses,(arrayRegOpnd->headSegmentSym->super_Sym).m_id);
      BVSparse<Memory::JitArenaAllocator>::Set
                (pBVar3->noImplicitCallJsArrayHeadSegmentSymUses,
                 (arrayRegOpnd->headSegmentSym->super_Sym).m_id);
      pSVar11 = arrayRegOpnd->headSegmentLengthSym;
      if (pSVar11 != (StackSym *)0x0) {
LAB_003cf413:
        ProcessStackSymUse(this,pSVar11,'\x01');
        pBVar3 = local_68;
        BVSparse<Memory::JitArenaAllocator>::Set
                  (local_68->noImplicitCallUses,(arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id
                  );
        BVSparse<Memory::JitArenaAllocator>::Set
                  (pBVar3->noImplicitCallJsArrayHeadSegmentSymUses,
                   (arrayRegOpnd->headSegmentLengthSym->super_Sym).m_id);
      }
    }
  }
LAB_003cf63c:
  pSVar11 = IR::ArrayRegOpnd::LengthSym(pAVar17);
  if ((pSVar11 != (StackSym *)0x0) && (pSVar11 != arrayRegOpnd->headSegmentLengthSym)) {
    ProcessStackSymUse(this,pSVar11,'\x01');
    bVar5 = ValueType::IsArray((ValueType *)&local_3e.field_0);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x1306,"(arrayValueType.IsArray())","arrayValueType.IsArray()");
      if (!bVar5) {
LAB_003cfce5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar10 = 0;
    }
    pBVar3 = local_68;
    BVSparse<Memory::JitArenaAllocator>::Set(local_68->noImplicitCallUses,(pSVar11->super_Sym).m_id)
    ;
    BVSparse<Memory::JitArenaAllocator>::Set
              (pBVar3->noImplicitCallArrayLengthSymUses,(pSVar11->super_Sym).m_id);
  }
  return;
}

Assistant:

void
BackwardPass::ProcessArrayRegOpndUse(IR::Instr *const instr, IR::ArrayRegOpnd *const arrayRegOpnd)
{
    Assert(tag == Js::DeadStorePhase);
    Assert(!IsCollectionPass());
    Assert(instr);
    Assert(arrayRegOpnd);

    if(!(arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym() || arrayRegOpnd->LengthSym()))
    {
        return;
    }

    const ValueType arrayValueType(arrayRegOpnd->GetValueType());
    const bool isJsArray = !arrayValueType.IsLikelyTypedArray();
    Assert(isJsArray == arrayValueType.IsArrayOrObjectWithArray());
    Assert(!isJsArray == arrayValueType.IsOptimizedTypedArray());

    BasicBlock *const block = currentBlock;
    if(!IsPrePass() &&
        (arrayRegOpnd->HeadSegmentSym() || arrayRegOpnd->HeadSegmentLengthSym()) &&
        (!isJsArray || instr->m_opcode != Js::OpCode::NoImplicitCallUses))
    {
        bool headSegmentIsLoadedButUnused =
            instr->loadedArrayHeadSegment &&
            arrayRegOpnd->HeadSegmentSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentSym()->m_id);
        const bool headSegmentLengthIsLoadedButUnused =
            instr->loadedArrayHeadSegmentLength &&
            arrayRegOpnd->HeadSegmentLengthSym() &&
            !block->upwardExposedUses->Test(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        if(headSegmentLengthIsLoadedButUnused && instr->extractedUpperBoundCheckWithoutHoisting)
        {
            // Find the upper bound check (index[src1] <= headSegmentLength[src2] + offset[dst])
            IR::Instr *upperBoundCheck = this->globOpt->FindUpperBoundsCheckInstr(instr);
            Assert(upperBoundCheck && upperBoundCheck != instr);
            Assert(upperBoundCheck->GetSrc2()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());

            // Find the head segment length load
            IR::Instr *headSegmentLengthLoad = this->globOpt->FindArraySegmentLoadInstr(upperBoundCheck);

            Assert(headSegmentLengthLoad->GetDst()->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym());
            Assert(
                headSegmentLengthLoad->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->m_sym ==
                (isJsArray ? arrayRegOpnd->HeadSegmentSym() : arrayRegOpnd->m_sym));

            // Fold the head segment length load into the upper bound check. Keep the load instruction there with a Nop so that
            // the head segment length sym can be marked as unused before the Nop. The lowerer will remove it.
            upperBoundCheck->ReplaceSrc2(headSegmentLengthLoad->UnlinkSrc1());
            headSegmentLengthLoad->m_opcode = Js::OpCode::Nop;

            if(isJsArray)
            {
                // The head segment length is on the head segment, so the bound check now uses the head segment sym
                headSegmentIsLoadedButUnused = false;
            }
        }

        if(headSegmentIsLoadedButUnused || headSegmentLengthIsLoadedButUnused)
        {
            // Check if the head segment / head segment length are being loaded here. If so, remove them and let the fast
            // path load them since it does a better job.
            IR::ArrayRegOpnd *noImplicitCallArrayUse = nullptr;
            if(isJsArray)
            {
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd,
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            const ValueType checkedSrcValueType(checkedSrc->GetValueType());
                            if(!checkedSrcValueType.IsLikelyObject() ||
                                checkedSrcValueType.GetObjectType() != arrayValueType.GetObjectType())
                            {
                                return false;
                            }

                            IR::RegOpnd *const checkedRegSrc = checkedSrc->AsRegOpnd();
                            if(!checkedRegSrc->IsArrayRegOpnd())
                            {
                                return false;
                            }

                            IR::ArrayRegOpnd *const checkedArraySrc = checkedRegSrc->AsArrayRegOpnd();
                            if(headSegmentIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentSym() != arrayRegOpnd->HeadSegmentSym())
                            {
                                return false;
                            }
                            if(headSegmentLengthIsLoadedButUnused &&
                                checkedArraySrc->HeadSegmentLengthSym() != arrayRegOpnd->HeadSegmentLengthSym())
                            {
                                return false;
                            }
                            return true;
                        });
                if(use)
                {
                    noImplicitCallArrayUse = use->AsRegOpnd()->AsArrayRegOpnd();
                }
            }
            else if(headSegmentLengthIsLoadedButUnused)
            {
                // A typed array's head segment length may be zeroed when the typed array's buffer is transferred to a web
                // worker, so the head segment length sym use is included in a NoImplicitCallUses instruction. Since there
                // are no forward uses of the head segment length sym, to allow removing the extracted head segment length
                // load, the corresponding head segment length sym use in the NoImplicitCallUses instruction must also be
                // removed.
                IR::Instr *noImplicitCallUsesInstr;
                IR::Opnd *const use =
                    FindNoImplicitCallUse(
                        instr,
                        arrayRegOpnd->HeadSegmentLengthSym(),
                        [&](IR::Opnd *const checkedSrc) -> bool
                        {
                            return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                        },
                        &noImplicitCallUsesInstr);
                if(use)
                {
                    Assert(noImplicitCallUsesInstr);
                    Assert(!noImplicitCallUsesInstr->GetDst());
                    Assert(noImplicitCallUsesInstr->GetSrc1());
                    if(use == noImplicitCallUsesInstr->GetSrc1())
                    {
                        if(noImplicitCallUsesInstr->GetSrc2())
                        {
                            noImplicitCallUsesInstr->ReplaceSrc1(noImplicitCallUsesInstr->UnlinkSrc2());
                        }
                        else
                        {
                            noImplicitCallUsesInstr->FreeSrc1();
                            noImplicitCallUsesInstr->m_opcode = Js::OpCode::Nop;
                        }
                    }
                    else
                    {
                        Assert(use == noImplicitCallUsesInstr->GetSrc2());
                        noImplicitCallUsesInstr->FreeSrc2();
                    }
                }
            }

            if(headSegmentIsLoadedButUnused &&
                (!isJsArray || !arrayRegOpnd->HeadSegmentLengthSym() || headSegmentLengthIsLoadedButUnused))
            {
                // For JS arrays, the head segment length load is dependent on the head segment. So, only remove the head
                // segment load if the head segment length load can also be removed.
                arrayRegOpnd->RemoveHeadSegmentSym();
                instr->loadedArrayHeadSegment = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentSym();
                }
            }
            if(headSegmentLengthIsLoadedButUnused)
            {
                arrayRegOpnd->RemoveHeadSegmentLengthSym();
                instr->loadedArrayHeadSegmentLength = false;
                if(noImplicitCallArrayUse)
                {
                    noImplicitCallArrayUse->RemoveHeadSegmentLengthSym();
                }
            }
        }
    }

    if(isJsArray && instr->m_opcode != Js::OpCode::NoImplicitCallUses)
    {
        // Only uses in NoImplicitCallUses instructions are counted toward liveness
        return;
    }

    // Treat dependent syms as uses. For JS arrays, only uses in NoImplicitCallUses count because only then the assumptions made
    // on the dependent syms are guaranteed to be valid. Similarly for typed arrays, a head segment length sym use counts toward
    // liveness only in a NoImplicitCallUses instruction.
    if(arrayRegOpnd->HeadSegmentSym())
    {
        ProcessStackSymUse(arrayRegOpnd->HeadSegmentSym(), true);
        if(isJsArray)
        {
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentSym()->m_id);
        }
    }
    if(arrayRegOpnd->HeadSegmentLengthSym())
    {
        if(isJsArray)
        {
            ProcessStackSymUse(arrayRegOpnd->HeadSegmentLengthSym(), true);
            block->noImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            block->noImplicitCallJsArrayHeadSegmentSymUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
        }
        else
        {
            // ProcessNoImplicitCallUses automatically marks JS array reg opnds and their corresponding syms as live. A typed
            // array's head segment length sym also needs to be marked as live at its use in the NoImplicitCallUses instruction,
            // but it is just in a reg opnd. Flag the opnd to have the sym be marked as live when that instruction is processed.
            IR::Opnd *const use =
                FindNoImplicitCallUse(
                    instr,
                    arrayRegOpnd->HeadSegmentLengthSym(),
                    [&](IR::Opnd *const checkedSrc) -> bool
                    {
                        return checkedSrc->AsRegOpnd()->m_sym == arrayRegOpnd->HeadSegmentLengthSym();
                    });
            if(use)
            {
                considerSymsAsRealUsesInNoImplicitCallUses->Set(arrayRegOpnd->HeadSegmentLengthSym()->m_id);
            }
        }
    }
    StackSym *const lengthSym = arrayRegOpnd->LengthSym();
    if(lengthSym && lengthSym != arrayRegOpnd->HeadSegmentLengthSym())
    {
        ProcessStackSymUse(lengthSym, true);
        Assert(arrayValueType.IsArray());
        block->noImplicitCallUses->Set(lengthSym->m_id);
        block->noImplicitCallArrayLengthSymUses->Set(lengthSym->m_id);
    }
}